

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

AsmJsFunctionInfo * __thiscall Js::FunctionBody::AllocateAsmJsFunctionInfo(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  AsmJsFunctionInfo *pAVar3;
  undefined4 *puVar4;
  Recycler *pRVar5;
  TrackAllocData local_38;
  FunctionBody *local_10;
  FunctionBody *this_local;
  
  local_10 = this;
  pAVar3 = GetAsmJsFunctionInfo(this);
  if (pAVar3 != (AsmJsFunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x198f,"(!this->GetAsmJsFunctionInfo())",
                                "!this->GetAsmJsFunctionInfo()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pRVar5 = ScriptContext::GetRecycler
                     ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_38,(type_info *)&AsmJsFunctionInfo::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
             ,0x1990);
  pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_38);
  pAVar3 = (AsmJsFunctionInfo *)new<Memory::Recycler>(0xd0,pRVar5,0x43c4b0);
  AsmJsFunctionInfo::AsmJsFunctionInfo(pAVar3);
  FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)2,Js::AsmJsFunctionInfo*>
            ((FunctionProxy *)this,pAVar3);
  pAVar3 = GetAsmJsFunctionInfo(this);
  return pAVar3;
}

Assistant:

AsmJsFunctionInfo* FunctionBody::AllocateAsmJsFunctionInfo()
    {
        Assert( !this->GetAsmJsFunctionInfo() );
        this->SetAuxPtr<AuxPointerType::AsmJsFunctionInfo>(RecyclerNew( m_scriptContext->GetRecycler(), AsmJsFunctionInfo));
        return this->GetAsmJsFunctionInfo();
    }